

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# long_branch_link.c
# Opt level: O1

void long_branch_link(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = thminstr->raw & 0x7ff;
  if ((thminstr->raw >> 0xb & 1) == 0) {
    uVar2 = sign_extend_word(uVar5,0xb,0x20);
    uVar5 = uVar2 * 0x1000 + state->pc;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",0xe,(ulong)uVar5);
    }
    switch((state->cpsr).raw & 0x1f) {
    case 0x11:
      state->lr_fiq = uVar5;
      break;
    case 0x12:
      state->lr_irq = uVar5;
      break;
    case 0x13:
      state->lr_svc = uVar5;
      break;
    default:
      state->lr = uVar5;
      break;
    case 0x17:
      state->lr_abt = uVar5;
      break;
    case 0x1b:
      state->lr_und = uVar5;
    }
    return;
  }
  uVar3 = ((state->cpsr).raw & 0x1f) - 0x11;
  lVar4 = 0x98;
  if (uVar3 < 0xb) {
    lVar4 = *(long *)(&DAT_00125678 + (ulong)uVar3 * 8);
  }
  iVar1 = *(int *)((long)state->r + lVar4 + -0x38);
  uVar3 = (state->pc | 1) - 2;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xe,(ulong)uVar3);
  }
  switch((state->cpsr).raw & 0x1f) {
  case 0x11:
    state->lr_fiq = uVar3;
    break;
  case 0x12:
    state->lr_irq = uVar3;
    break;
  case 0x13:
    state->lr_svc = uVar3;
    break;
  default:
    state->lr = uVar3;
    break;
  case 0x17:
    state->lr_abt = uVar3;
    break;
  case 0x1b:
    state->lr_und = uVar3;
  }
  uVar5 = iVar1 + uVar5 * 2 + 1;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xf,(ulong)uVar5);
  }
  if (((uint)state->cpsr & 0x20) == 0) {
    uVar2 = uVar5 & 0xfffffffe;
  }
  else {
    uVar2 = uVar5 | 1;
  }
  set_pc(state,uVar2);
  return;
}

Assistant:

void long_branch_link(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    long_branch_link_t* instr = &thminstr->LONG_BRANCH_LINK;
    word offset = instr->offset;

    if (instr->h) {
        offset <<= 1;
        word oldlr = get_register(state, REG_LR);
        word oldpc = get_register(state, REG_PC);
        word full_address = oldlr + offset + 1;
        set_register(state, REG_LR, (oldpc - 2) | 1);
        set_register(state, REG_PC, full_address);
    } else {
        offset = sign_extend_word(offset, 11, 32);
        offset <<= 12;
        set_register(state, REG_LR, state->pc + offset);
    }

}